

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          tag_t<cfgfile::qstring_trait_t> *parent,child_tags_list_t *list)

{
  pointer pptVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  logic_error *this_00;
  pointer pptVar5;
  lexeme_t<cfgfile::qstring_trait_t> lexeme;
  qstring_wrapper_t local_248;
  string local_228;
  lexeme_t<cfgfile::qstring_trait_t> local_208;
  string local_1e8;
  string local_1c8;
  string_t local_1a8;
  string_t local_190;
  string_t local_178;
  string_t local_160;
  string_t local_148;
  string_t local_130;
  qstring_wrapper_t local_118;
  qstring_wrapper_t local_100;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_d0;
  qstring_wrapper_t local_b8;
  qstring_wrapper_t local_a0;
  qstring_wrapper_t local_88;
  string local_70;
  string local_50;
  
  lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(&local_208,&this->m_lex);
  pptVar5 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar1 = (list->
            super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pptVar5 != pptVar1) {
    do {
      bVar4 = start_tag_parsing(this,&local_208,*pptVar5);
      if (bVar4) {
        if (&(local_208.m_value.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_208.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_208.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_208.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_208.m_value.m_str.d.d)->super_QArrayData,2,8);
          }
        }
        return;
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 != pptVar1);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x28);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"Unexpected tag name. We expected one child tag of tag \"","");
  qstring_trait_t::from_ascii(&local_130,&local_228);
  operator+(&local_118,&local_130,&parent->m_name);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\", but we\'ve got \"","");
  qstring_trait_t::from_ascii(&local_148,&local_50);
  operator+(&local_100,&local_118,&local_148);
  operator+(&local_e8,&local_100,&local_208.m_value);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_160,&local_70);
  operator+(&local_d0,&local_e8,&local_160);
  operator+(&local_b8,&local_d0,&((this->m_lex).m_stream)->m_file_name);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"\" on line ","");
  qstring_trait_t::from_ascii(&local_178,&local_1c8);
  operator+(&local_a0,&local_b8,&local_178);
  qstring_trait_t::to_string(&local_190,(this->m_lex).m_line_number);
  operator+(&local_88,&local_a0,&local_190);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,".","");
  qstring_trait_t::from_ascii(&local_1a8,&local_1e8);
  operator+(&local_248,&local_88,&local_1a8);
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__exception_t_00121a28;
  *(undefined8 *)(this_00 + 0x20) = 0;
  uVar2 = local_248.m_str.d.d._0_4_;
  uVar3 = local_248.m_str.d.d._4_4_;
  local_248.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this_00 + 0x10) = uVar2;
  *(undefined4 *)(this_00 + 0x14) = uVar3;
  *(undefined4 *)(this_00 + 0x18) = local_248.m_str.d.ptr._0_4_;
  *(undefined4 *)(this_00 + 0x1c) = local_248.m_str.d.ptr._4_4_;
  local_248.m_str.d.ptr = (char16_t *)0x0;
  *(qsizetype *)(this_00 + 0x20) = local_248.m_str.d.size;
  local_248.m_str.d.size = 0;
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}